

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetOwnPropertyNames2(JSContext *ctx,JSValue obj1,int flags,int kind)

{
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  uint in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  int in_R8D;
  JSValue JVar4;
  JSValue JVar5;
  BOOL unaff_retaddr;
  int res;
  JSPropertyDescriptor desc;
  JSAtom atom;
  uint32_t j;
  uint32_t i;
  uint32_t len;
  JSPropertyEnum *atoms;
  JSObject *p;
  JSValue value;
  JSValue key;
  JSValue val;
  JSValue r;
  JSValue obj;
  undefined4 in_stack_fffffffffffffe08;
  JSAtom in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe1c;
  int64_t in_stack_fffffffffffffe20;
  JSValueUnion in_stack_fffffffffffffe28;
  JSContext *in_stack_fffffffffffffe30;
  JSValue in_stack_fffffffffffffe38;
  JSValue in_stack_fffffffffffffe48;
  uint local_180;
  JSContext *in_stack_fffffffffffffea0;
  JSValue in_stack_fffffffffffffea8;
  JSObject *local_128;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  uint uVar6;
  uint in_stack_ffffffffffffff0c;
  JSPropertyEnum **in_stack_ffffffffffffff10;
  JSValueUnion local_b0;
  undefined4 local_a8;
  JSAtom prop;
  undefined4 uVar7;
  JSAtom prop_00;
  int32_t local_70;
  undefined4 uStack_6c;
  int64_t local_68;
  JSValueUnion local_40;
  JSContext *local_38;
  
  iVar3 = 0;
  JVar4 = JS_ToObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
  uVar7 = JVar4.u._0_4_;
  prop_00 = JVar4.u._4_4_;
  local_128 = (JSObject *)JVar4.tag;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 != 0) {
    local_70 = 0;
    local_68 = 6;
    goto LAB_00179a08;
  }
  iVar2 = JS_GetOwnPropertyNamesInternal
                    ((JSContext *)CONCAT44(prop_00,uVar7),in_stack_ffffffffffffff10,
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (JSObject *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),iVar3
                    );
  if (iVar2 == 0) {
    JVar4 = JS_NewArray((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_b0 = JVar4.u;
    local_a8 = (undefined4)JVar4.tag;
    prop = JVar4.tag._4_4_;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 != 0) goto LAB_00179967;
    local_40 = in_stack_fffffffffffffe28;
    local_38 = in_stack_fffffffffffffe30;
    for (uVar6 = 0; uVar6 < in_stack_ffffffffffffff0c; uVar6 = uVar6 + 1) {
      if ((in_ECX & 0x10) == 0) {
LAB_0017957b:
        in_stack_fffffffffffffe14 = in_R8D;
        iVar2 = JVar4.u._0_4_;
        in_R8D = in_stack_fffffffffffffe14;
        if (in_stack_fffffffffffffe14 == 0) {
LAB_001795a8:
          JVar5 = JS_AtomToValue((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                 in_stack_fffffffffffffe0c);
          iVar3 = JS_IsException(JVar5);
joined_r0x001795f8:
          if (iVar3 != 0) goto LAB_00179967;
        }
        else {
          if (in_stack_fffffffffffffe14 == 1) {
            in_stack_fffffffffffffe08 = 0;
            obj_00.tag = in_RSI;
            obj_00.u.ptr = in_RDI.ptr;
            this_obj.tag._0_4_ = 1;
            this_obj.u.ptr = local_128;
            this_obj.tag._4_4_ = in_ECX;
            JVar5 = JS_GetPropertyInternal
                              ((JSContext *)CONCAT44(prop_00,uVar7),obj_00,prop,this_obj,
                               unaff_retaddr);
            iVar3 = JS_IsException(JVar5);
            goto joined_r0x001795f8;
          }
          if (in_stack_fffffffffffffe14 != 2) goto LAB_001795a8;
          in_stack_fffffffffffffe48 =
               JS_NewArray((JSContext *)CONCAT44(2,in_stack_fffffffffffffe10));
          iVar3 = JS_IsException(in_stack_fffffffffffffe48);
          if (iVar3 != 0) goto LAB_00179967;
          in_stack_fffffffffffffe38 =
               JS_AtomToValue((JSContext *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                              in_stack_fffffffffffffe0c);
          iVar3 = JS_IsException(in_stack_fffffffffffffe38);
          if (iVar3 != 0) {
LAB_0017994a:
            JVar4.u._4_4_ = in_stack_fffffffffffffe1c;
            JVar4.u.int32 = in_stack_fffffffffffffe18;
            JVar4.tag = in_stack_fffffffffffffe20;
            JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         JVar4);
            goto LAB_00179967;
          }
          in_stack_fffffffffffffe08 = 0x4000;
          iVar3 = JS_CreateDataPropertyUint32
                            (local_38,in_stack_fffffffffffffe48,(int64_t)local_40,
                             in_stack_fffffffffffffe38,iVar2);
          if (iVar3 < 0) goto LAB_0017994a;
          in_stack_fffffffffffffe08 = 0;
          obj_01.tag = in_RSI;
          obj_01.u.float64 = in_RDI.float64;
          JVar5.tag._0_4_ = in_R8D;
          JVar5.u = (JSValueUnion)local_128;
          JVar5.tag._4_4_ = in_ECX;
          JVar5 = JS_GetPropertyInternal
                            ((JSContext *)CONCAT44(prop_00,uVar7),obj_01,prop,JVar5,unaff_retaddr);
          local_40 = JVar5.u;
          local_38 = (JSContext *)JVar5.tag;
          iVar3 = JS_IsException(JVar5);
          if (iVar3 != 0) goto LAB_0017994a;
          in_stack_fffffffffffffe08 = 0x4000;
          iVar3 = JS_CreateDataPropertyUint32
                            (local_38,in_stack_fffffffffffffe48,(int64_t)local_40,
                             in_stack_fffffffffffffe38,iVar2);
          if (iVar3 < 0) goto LAB_0017994a;
        }
        in_stack_fffffffffffffe08 = 0;
        iVar2 = JS_CreateDataPropertyUint32
                          (local_38,in_stack_fffffffffffffe48,(int64_t)local_40,
                           in_stack_fffffffffffffe38,iVar2);
        if (iVar2 < 0) goto LAB_00179967;
      }
      else {
        iVar2 = JS_GetOwnPropertyInternal
                          ((JSContext *)in_RDI.ptr,(JSPropertyDescriptor *)CONCAT44(in_ECX,in_R8D),
                           local_128,prop_00);
        if (iVar2 < 0) goto LAB_00179967;
        if ((iVar2 != 0) &&
           (js_free_desc((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (JSPropertyDescriptor *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
           (local_180 & 4) != 0)) goto LAB_0017957b;
      }
    }
  }
  else {
LAB_00179967:
    v.u._4_4_ = in_stack_fffffffffffffe1c;
    v.u.int32 = in_stack_fffffffffffffe18;
    v.tag = in_stack_fffffffffffffe20;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),v);
    in_stack_fffffffffffffe18 = 0;
    in_stack_fffffffffffffe20 = 6;
    local_b0.ptr = (void *)((ulong)in_stack_fffffffffffffe1c << 0x20);
    local_a8 = 6;
    prop = 0;
  }
  js_free_prop_enum((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                    (JSPropertyEnum *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                    0);
  v_00.u._4_4_ = in_stack_fffffffffffffe1c;
  v_00.u.int32 = in_stack_fffffffffffffe18;
  v_00.tag = in_stack_fffffffffffffe20;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),v_00);
  local_70 = local_b0.int32;
  uStack_6c = local_b0._4_4_;
  local_68 = CONCAT44(prop,local_a8);
LAB_00179a08:
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
}

Assistant:

static JSValue JS_GetOwnPropertyNames2(JSContext *ctx, JSValueConst obj1,
                                       int flags, int kind)
{
    JSValue obj, r, val, key, value;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i, j;

    r = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, obj1);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, flags & ~JS_GPN_ENUM_ONLY))
        goto exception;
    r = JS_NewArray(ctx);
    if (JS_IsException(r))
        goto exception;
    for(j = i = 0; i < len; i++) {
        JSAtom atom = atoms[i].atom;
        if (flags & JS_GPN_ENUM_ONLY) {
            JSPropertyDescriptor desc;
            int res;

            /* Check if property is still enumerable */
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
            if (res < 0)
                goto exception;
            if (!res)
                continue;
            js_free_desc(ctx, &desc);
            if (!(desc.flags & JS_PROP_ENUMERABLE))
                continue;
        }
        switch(kind) {
        default:
        case JS_ITERATOR_KIND_KEY:
            val = JS_AtomToValue(ctx, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_VALUE:
            val = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_KEY_AND_VALUE:
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto exception;
            key = JS_AtomToValue(ctx, atom);
            if (JS_IsException(key))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 0, key, JS_PROP_THROW) < 0)
                goto exception1;
            value = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(value))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 1, value, JS_PROP_THROW) < 0)
                goto exception1;
            break;
        }
        if (JS_CreateDataPropertyUint32(ctx, r, j++, val, 0) < 0)
            goto exception;
    }
    goto done;

exception1:
    JS_FreeValue(ctx, val);
exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
done:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, obj);
    return r;
}